

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpConnection.h
# Opt level: O0

void __thiscall
Liby::UdpConnection::UdpConnection(UdpConnection *this,UdpSocket *socket,Endpoint *ep)

{
  Endpoint *ep_local;
  UdpSocket *socket_local;
  UdpConnection *this_local;
  
  std::enable_shared_from_this<Liby::UdpConnection>::enable_shared_from_this
            (&this->super_enable_shared_from_this<Liby::UdpConnection>);
  this->socket_ = socket;
  Buffer::Buffer(&this->readBuf_,0x400);
  if (this->socket_ != (UdpSocket *)0x0) {
    (this->peer_).sin_addr.s_addr = ep->addr_;
    (this->peer_).sin_port = ep->port_;
    (this->peer_).sin_family = 2;
    return;
  }
  __assert_fail("socket_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpConnection.h"
                ,0xf,"Liby::UdpConnection::UdpConnection(UdpSocket *, const Endpoint &)");
}

Assistant:

UdpConnection(UdpSocket *socket, const Endpoint &ep)
        : socket_(socket), readBuf_(1024) {
        assert(socket_);
        peer_.sin_addr.s_addr = ep.addr_;
        peer_.sin_port = ep.port_;
        peer_.sin_family = AF_INET;
    }